

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O0

tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
burst::detail::
by_all_impl<0ul,1ul,DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_9()::__0_const,std::tuple<std::tuple<int,std::__cxx11::string>&,std::tuple<std::__cxx11::string,double>&>&>
          (_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           param_1,__0 *param_2,
          tuple<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
          *param_3)

{
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *t;
  __tuple_element_t<0UL,_tuple<int,_basic_string<char>_>_> *__a1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *t_00;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_double>_> *__a2;
  _Head_base<0UL,_int_&,_false> extraout_RDX;
  tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  tVar1;
  tuple<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
  *t_local;
  anon_class_1_0_00000001 *f_local;
  
  t = std::get<0ul,std::tuple<int,std::__cxx11::string>&,std::tuple<std::__cxx11::string,double>&>
                (param_3);
  __a1 = DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_9()::$_0::operator()(param_2,t);
  t_00 = std::
         get<1ul,std::tuple<int,std::__cxx11::string>&,std::tuple<std::__cxx11::string,double>&>
                   (param_3);
  __a2 = DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_9()::$_0::operator()(param_2,t_00);
  std::
  tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  tuple<true,_true>((tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)param_1.
                       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                       ._M_head_impl,__a1,__a2);
  tVar1.
  super__Tuple_impl<0UL,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_int_&,_false>._M_head_impl = extraout_RDX._M_head_impl;
  tVar1.
  super__Tuple_impl<0UL,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       param_1.
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
       ._M_head_impl;
  return (tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          )tVar1.
           super__Tuple_impl<0UL,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }